

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_primitives.cpp
# Opt level: O3

spv_result_t spvtools::val::PrimitivesPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint32_t id;
  bool bVar2;
  uint32_t id_00;
  Op opcode;
  int32_t iVar3;
  Function *this;
  char *pcVar4;
  long *plVar5;
  DiagnosticStream *pDVar6;
  size_type *psVar7;
  long lVar8;
  Op opcode_00;
  spv_result_t sVar9;
  allocator<char> local_229;
  long *local_228 [2];
  long local_218 [2];
  undefined1 local_208 [472];
  
  uVar1 = (inst->inst_).opcode;
  opcode_00 = (Op)uVar1;
  if (uVar1 - 0xda < 4) {
    this = ValidationState_t::function(_,inst->function_->id_);
    pcVar4 = spvOpcodeString(opcode_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_228,pcVar4,&local_229);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_228);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      local_208._16_8_ = *psVar7;
      local_208._24_8_ = plVar5[3];
      local_208._0_8_ = local_208 + 0x10;
    }
    else {
      local_208._16_8_ = *psVar7;
      local_208._0_8_ = (size_type *)*plVar5;
    }
    local_208._8_8_ = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Function::RegisterExecutionModelLimitation(this,ExecutionModelGeometry,(string *)local_208);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if (local_228[0] != local_218) {
      operator_delete(local_228[0],local_218[0] + 1);
    }
  }
  sVar9 = SPV_SUCCESS;
  if ((opcode_00 & ~OpUndef) == OpEmitStreamVertex) {
    id = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    id_00 = ValidationState_t::GetTypeId(_,id);
    bVar2 = ValidationState_t::IsIntScalarType(_,id_00);
    if (bVar2) {
      opcode = ValidationState_t::GetIdOpcode(_,id);
      iVar3 = spvOpcodeIsConstant(opcode);
      if (iVar3 != 0) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      local_228[0] = (long *)spvOpcodeString(opcode_00);
      pDVar6 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)local_228);
      pcVar4 = ": expected Stream to be constant instruction";
      lVar8 = 0x2c;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      local_228[0] = (long *)spvOpcodeString(opcode_00);
      pDVar6 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)local_228);
      pcVar4 = ": expected Stream to be int scalar";
      lVar8 = 0x22;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar6,pcVar4,lVar8);
    sVar9 = pDVar6->error_;
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  }
  return sVar9;
}

Assistant:

spv_result_t PrimitivesPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  switch (opcode) {
    case spv::Op::OpEmitVertex:
    case spv::Op::OpEndPrimitive:
    case spv::Op::OpEmitStreamVertex:
    case spv::Op::OpEndStreamPrimitive:
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Geometry,
              std::string(spvOpcodeString(opcode)) +
                  " instructions require Geometry execution model");
      break;
    default:
      break;
  }

  switch (opcode) {
    case spv::Op::OpEmitStreamVertex:
    case spv::Op::OpEndStreamPrimitive: {
      const uint32_t stream_id = inst->word(1);
      const uint32_t stream_type = _.GetTypeId(stream_id);
      if (!_.IsIntScalarType(stream_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Stream to be int scalar";
      }

      const spv::Op stream_opcode = _.GetIdOpcode(stream_id);
      if (!spvOpcodeIsConstant(stream_opcode)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Stream to be constant instruction";
      }
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}